

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O1

Status __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getPrimalray(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *p_vector)

{
  int *piVar1;
  int iVar2;
  pointer pnVar3;
  int iVar4;
  Status SVar5;
  undefined8 *puVar6;
  iterator __begin0;
  pointer pnVar7;
  long lVar8;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *__range2;
  uint *puVar9;
  uint *puVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  pointer pnVar11;
  long lVar12;
  long lVar13;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if (this->initialized == false) {
    puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"XSOLVE10 No Problem loaded","");
    *puVar6 = &PTR__SPxException_006a9ee8;
    puVar6[1] = puVar6 + 3;
    std::__cxx11::string::_M_construct<char*>((string *)(puVar6 + 1),local_40,local_40 + local_38);
    *puVar6 = &PTR__SPxException_006aa100;
    __cxa_throw(puVar6,&SPxStatusException::typeinfo,SPxException::~SPxException);
  }
  pnVar3 = (p_vector->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pnVar7 = (p_vector->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (pnVar11 = pnVar7; pnVar11 != pnVar3; pnVar11 = pnVar11 + 1) {
    (pnVar11->m_backend).fpclass = cpp_dec_float_finite;
    (pnVar11->m_backend).prec_elem = 0x1c;
    (pnVar11->m_backend).data._M_elems[0] = 0;
    (pnVar11->m_backend).data._M_elems[1] = 0;
    (pnVar11->m_backend).data._M_elems[2] = 0;
    (pnVar11->m_backend).data._M_elems[3] = 0;
    (pnVar11->m_backend).data._M_elems[4] = 0;
    (pnVar11->m_backend).data._M_elems[5] = 0;
    (pnVar11->m_backend).data._M_elems[6] = 0;
    (pnVar11->m_backend).data._M_elems[7] = 0;
    (pnVar11->m_backend).data._M_elems[8] = 0;
    (pnVar11->m_backend).data._M_elems[9] = 0;
    (pnVar11->m_backend).data._M_elems[10] = 0;
    (pnVar11->m_backend).data._M_elems[0xb] = 0;
    (pnVar11->m_backend).data._M_elems[0xc] = 0;
    (pnVar11->m_backend).data._M_elems[0xd] = 0;
    (pnVar11->m_backend).data._M_elems[0xe] = 0;
    (pnVar11->m_backend).data._M_elems[0xf] = 0;
    (pnVar11->m_backend).data._M_elems[0x10] = 0;
    (pnVar11->m_backend).data._M_elems[0x11] = 0;
    (pnVar11->m_backend).data._M_elems[0x12] = 0;
    (pnVar11->m_backend).data._M_elems[0x13] = 0;
    (pnVar11->m_backend).data._M_elems[0x14] = 0;
    (pnVar11->m_backend).data._M_elems[0x15] = 0;
    (pnVar11->m_backend).data._M_elems[0x16] = 0;
    (pnVar11->m_backend).data._M_elems[0x17] = 0;
    (pnVar11->m_backend).data._M_elems[0x18] = 0;
    (pnVar11->m_backend).data._M_elems[0x19] = 0;
    (pnVar11->m_backend).data._M_elems[0x1a] = 0;
    (pnVar11->m_backend).data._M_elems[0x1b] = 0;
    *(undefined8 *)((long)(pnVar11->m_backend).data._M_elems + 0x6d) = 0;
  }
  for (; pnVar7 != pnVar3; pnVar7 = pnVar7 + 1) {
    (pnVar7->m_backend).fpclass = cpp_dec_float_finite;
    (pnVar7->m_backend).prec_elem = 0x1c;
    (pnVar7->m_backend).data._M_elems[0] = 0;
    (pnVar7->m_backend).data._M_elems[1] = 0;
    (pnVar7->m_backend).data._M_elems[2] = 0;
    (pnVar7->m_backend).data._M_elems[3] = 0;
    (pnVar7->m_backend).data._M_elems[4] = 0;
    (pnVar7->m_backend).data._M_elems[5] = 0;
    (pnVar7->m_backend).data._M_elems[6] = 0;
    (pnVar7->m_backend).data._M_elems[7] = 0;
    (pnVar7->m_backend).data._M_elems[8] = 0;
    (pnVar7->m_backend).data._M_elems[9] = 0;
    (pnVar7->m_backend).data._M_elems[10] = 0;
    (pnVar7->m_backend).data._M_elems[0xb] = 0;
    (pnVar7->m_backend).data._M_elems[0xc] = 0;
    (pnVar7->m_backend).data._M_elems[0xd] = 0;
    (pnVar7->m_backend).data._M_elems[0xe] = 0;
    (pnVar7->m_backend).data._M_elems[0xf] = 0;
    (pnVar7->m_backend).data._M_elems[0x10] = 0;
    (pnVar7->m_backend).data._M_elems[0x11] = 0;
    (pnVar7->m_backend).data._M_elems[0x12] = 0;
    (pnVar7->m_backend).data._M_elems[0x13] = 0;
    (pnVar7->m_backend).data._M_elems[0x14] = 0;
    (pnVar7->m_backend).data._M_elems[0x15] = 0;
    (pnVar7->m_backend).data._M_elems[0x16] = 0;
    (pnVar7->m_backend).data._M_elems[0x17] = 0;
    (pnVar7->m_backend).data._M_elems[0x18] = 0;
    (pnVar7->m_backend).data._M_elems[0x19] = 0;
    (pnVar7->m_backend).data._M_elems[0x1a] = 0;
    (pnVar7->m_backend).data._M_elems[0x1b] = 0;
    *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + 0x6d) = 0;
  }
  if (0 < (this->primalRay).
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused) {
    lVar12 = 0x80;
    lVar13 = 0;
    do {
      piVar1 = (int *)((long)(((this->primalRay).
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .m_elem)->val).m_backend.data._M_elems + lVar12);
      iVar2 = *piVar1;
      pnVar7 = (p_vector->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar9 = (uint *)(piVar1 + -0x20);
      puVar10 = (uint *)(pnVar7 + iVar2);
      for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
        *puVar10 = *puVar9;
        puVar9 = puVar9 + 1;
        puVar10 = puVar10 + 1;
      }
      pnVar7[iVar2].m_backend.exp = piVar1[-4];
      pnVar7[iVar2].m_backend.neg = SUB41(piVar1[-3],0);
      iVar4 = piVar1[-1];
      pnVar7[iVar2].m_backend.fpclass = piVar1[-2];
      pnVar7[iVar2].m_backend.prec_elem = iVar4;
      lVar13 = lVar13 + 1;
      lVar12 = lVar12 + 0x84;
    } while (lVar13 < (this->primalRay).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused);
  }
  SVar5 = status(this);
  return SVar5;
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::getPrimalray(VectorBase<R>& p_vector) const
{

   assert(isInitialized());

   if(!isInitialized())
   {
      throw SPxStatusException("XSOLVE10 No Problem loaded");
      // return NOT_INIT;
   }

   assert(SPxBasisBase<R>::status() == SPxBasisBase<R>::UNBOUNDED);
   p_vector.clear();
   p_vector = primalRay;

   return status();
}